

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::print_const_value
          (t_java_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  __type _Var1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  iterator iVar5;
  iterator iVar6;
  reference pptVar7;
  string *psVar8;
  t_type *ptVar9;
  t_type *type_00;
  pointer ppVar10;
  reference pptVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  char *pcVar14;
  undefined1 local_3a8 [8];
  string val_5;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_378;
  const_iterator v_iter_2;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_4;
  t_type *etype;
  string local_340;
  string local_320;
  undefined1 local_300 [8];
  string val_3;
  string key;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_2b0;
  const_iterator v_iter_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_2;
  t_type *vtype;
  t_type *ktype;
  string local_270;
  string local_250 [8];
  string constructor_args;
  undefined1 local_210 [8];
  string cap_name;
  string val_1;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_148;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_140;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *local_138;
  t_type *local_130;
  t_type *field_type;
  _Base_ptr local_120;
  string local_118;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_f8;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  undefined1 local_c8 [8];
  vector<t_field_*,_std::allocator<t_field_*>_> fields;
  vector<t_field_*,_std::allocator<t_field_*>_> *unsorted_fields;
  undefined1 local_88 [8];
  string v2;
  string local_58;
  byte local_32;
  byte local_31;
  bool defval_local;
  t_const_value *ptStack_30;
  bool in_static_local;
  t_const_value *value_local;
  t_type *type_local;
  string *name_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  local_32 = defval;
  local_31 = in_static;
  ptStack_30 = value;
  value_local = (t_const_value *)type;
  type_local = (t_type *)name;
  name_local = (string *)out;
  out_local = (ostream *)this;
  value_local = (t_const_value *)t_generator::get_true_type(type);
  t_generator::indent((t_generator *)this,(ostream *)name_local);
  if ((local_32 & 1) == 0) {
    pcVar14 = "public static final ";
    if ((local_31 & 1) != 0) {
      pcVar14 = "";
    }
    poVar3 = std::operator<<((ostream *)name_local,pcVar14);
    type_name_abi_cxx11_(&local_58,this,(t_type *)value_local,false,false,false,false);
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_58);
  }
  uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x28))();
  if ((uVar4 & 1) == 0) {
    uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x50))();
    if ((uVar4 & 1) == 0) {
      uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x58))();
      if (((uVar4 & 1) == 0) &&
         (uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x60))(),
         (uVar4 & 1) == 0)) {
        uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x80))();
        if ((uVar4 & 1) == 0) {
          uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x70))();
          if (((uVar4 & 1) == 0) &&
             (uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x78))(),
             (uVar4 & 1) == 0)) {
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x18))();
            std::operator+(pbVar12,"compiler error: no const of type ",pbVar13);
            __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          bVar2 = is_enum_set(this,(t_type *)value_local);
          if (bVar2) {
            poVar3 = std::operator<<((ostream *)name_local,(string *)name);
            poVar3 = std::operator<<(poVar3," = ");
            type_name_abi_cxx11_(&local_320,this,(t_type *)value_local,false,true,true,false);
            poVar3 = std::operator<<(poVar3,(string *)&local_320);
            poVar3 = std::operator<<(poVar3,".noneOf(");
            inner_enum_type_name_abi_cxx11_(&local_340,this,(t_type *)value_local);
            poVar3 = std::operator<<(poVar3,(string *)&local_340);
            poVar3 = std::operator<<(poVar3,");");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_340);
            std::__cxx11::string::~string((string *)&local_320);
          }
          else {
            poVar3 = std::operator<<((ostream *)name_local,(string *)name);
            poVar3 = std::operator<<(poVar3," = new ");
            type_name_abi_cxx11_((string *)&etype,this,(t_type *)value_local,false,true,false,false)
            ;
            poVar3 = std::operator<<(poVar3,(string *)&etype);
            poVar3 = std::operator<<(poVar3,"();");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&etype);
          }
          if ((local_31 & 1) == 0) {
            poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar3 = std::operator<<(poVar3,"static {");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
            t_generator::indent_up((t_generator *)this);
          }
          uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x70))();
          if ((uVar4 & 1) == 0) {
            val_4 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                    t_set::get_elem_type((t_set *)value_local);
          }
          else {
            val_4 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                    t_list::get_elem_type((t_list *)value_local);
          }
          v_iter_2._M_current = (t_const_value **)t_const_value::get_list(ptStack_30);
          __gnu_cxx::
          __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
          ::__normal_iterator(&local_378);
          local_378._M_current =
               (t_const_value **)
               std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                         (v_iter_2._M_current);
          while( true ) {
            val_5.field_2._8_8_ =
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                           ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                            v_iter_2._M_current);
            bVar2 = __gnu_cxx::operator!=
                              (&local_378,
                               (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                *)((long)&val_5.field_2 + 8));
            psVar8 = name_local;
            if (!bVar2) break;
            pptVar11 = __gnu_cxx::
                       __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                       ::operator*(&local_378);
            render_const_value_abi_cxx11_
                      ((string *)local_3a8,this,(ostream *)psVar8,(t_type *)val_4,*pptVar11);
            poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar3 = std::operator<<(poVar3,(string *)name);
            poVar3 = std::operator<<(poVar3,".add(");
            poVar3 = std::operator<<(poVar3,(string *)local_3a8);
            poVar3 = std::operator<<(poVar3,");");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_3a8);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::operator++(&local_378);
          }
          if ((local_31 & 1) == 0) {
            t_generator::indent_down((t_generator *)this);
            poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar3 = std::operator<<(poVar3,"}");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          }
          std::operator<<((ostream *)name_local,(string *)&::endl_abi_cxx11_);
        }
        else {
          std::__cxx11::string::string(local_250);
          bVar2 = is_enum_map(this,(t_type *)value_local);
          if (bVar2) {
            inner_enum_type_name_abi_cxx11_(&local_270,this,(t_type *)value_local);
            std::__cxx11::string::operator=(local_250,(string *)&local_270);
            std::__cxx11::string::~string((string *)&local_270);
          }
          poVar3 = std::operator<<((ostream *)name_local,(string *)name);
          poVar3 = std::operator<<(poVar3," = new ");
          type_name_abi_cxx11_((string *)&ktype,this,(t_type *)value_local,false,true,false,false);
          poVar3 = std::operator<<(poVar3,(string *)&ktype);
          poVar3 = std::operator<<(poVar3,"(");
          poVar3 = std::operator<<(poVar3,local_250);
          poVar3 = std::operator<<(poVar3,");");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&ktype);
          if ((local_31 & 1) == 0) {
            poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar3 = std::operator<<(poVar3,"static {");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
            t_generator::indent_up((t_generator *)this);
          }
          ptVar9 = t_map::get_key_type((t_map *)value_local);
          type_00 = t_map::get_val_type((t_map *)value_local);
          v_iter_1._M_node = (_Base_ptr)t_const_value::get_map(ptStack_30);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_2b0);
          local_2b0._M_node =
               (_Base_ptr)
               std::
               map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               ::begin(v_iter_1._M_node);
          while( true ) {
            key.field_2._8_8_ =
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        *)v_iter_1._M_node);
            bVar2 = std::operator!=(&local_2b0,(_Self *)((long)&key.field_2 + 8));
            psVar8 = name_local;
            if (!bVar2) break;
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_2b0);
            render_const_value_abi_cxx11_
                      ((string *)((long)&val_3.field_2 + 8),this,(ostream *)psVar8,ptVar9,
                       ppVar10->first);
            psVar8 = name_local;
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_2b0);
            render_const_value_abi_cxx11_
                      ((string *)local_300,this,(ostream *)psVar8,type_00,ppVar10->second);
            poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar3 = std::operator<<(poVar3,(string *)name);
            poVar3 = std::operator<<(poVar3,".put(");
            poVar3 = std::operator<<(poVar3,(string *)(val_3.field_2._M_local_buf + 8));
            poVar3 = std::operator<<(poVar3,", ");
            poVar3 = std::operator<<(poVar3,(string *)local_300);
            poVar3 = std::operator<<(poVar3,");");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_300);
            std::__cxx11::string::~string((string *)(val_3.field_2._M_local_buf + 8));
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_2b0);
          }
          if ((local_31 & 1) == 0) {
            t_generator::indent_down((t_generator *)this);
            poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar3 = std::operator<<(poVar3,"}");
            std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          }
          std::operator<<((ostream *)name_local,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string(local_250);
        }
      }
      else {
        fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)t_struct::get_members((t_struct *)value_local);
        std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
                  ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_c8,
                   (vector<t_field_*,_std::allocator<t_field_*>_> *)
                   fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        iVar5 = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_c8);
        iVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_c8);
        std::
        sort<__gnu_cxx::__normal_iterator<t_field**,std::vector<t_field*,std::allocator<t_field*>>>,t_field::key_compare>
                  (iVar5._M_current,iVar6._M_current);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&val);
        v_iter._M_node = (_Base_ptr)t_const_value::get_map(ptStack_30);
        std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
        _Rb_tree_const_iterator(&local_f8);
        poVar3 = std::operator<<((ostream *)name_local,(string *)name);
        poVar3 = std::operator<<(poVar3," = new ");
        type_name_abi_cxx11_(&local_118,this,(t_type *)value_local,false,true,false,false);
        poVar3 = std::operator<<(poVar3,(string *)&local_118);
        poVar3 = std::operator<<(poVar3,"();");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_118);
        if ((local_31 & 1) == 0) {
          poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
          poVar3 = std::operator<<(poVar3,"static {");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          t_generator::indent_up((t_generator *)this);
        }
        local_120 = (_Base_ptr)
                    std::
                    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    ::begin(v_iter._M_node);
        local_f8._M_node = local_120;
        while( true ) {
          field_type = (t_type *)
                       std::
                       map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                              *)v_iter._M_node);
          bVar2 = std::operator!=(&local_f8,(_Self *)&field_type);
          if (!bVar2) break;
          local_130 = (t_type *)0x0;
          local_140._M_current =
               (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                         ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_c8);
          __gnu_cxx::
          __normal_iterator<t_field*const*,std::vector<t_field*,std::allocator<t_field*>>>::
          __normal_iterator<t_field**>
                    ((__normal_iterator<t_field*const*,std::vector<t_field*,std::allocator<t_field*>>>
                      *)&local_138,&local_140);
          val = local_138;
          while( true ) {
            local_148._M_current =
                 (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_c8);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&val,&local_148);
            psVar8 = name_local;
            ptVar9 = local_130;
            if (!bVar2) break;
            pptVar7 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                   *)&val);
            psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_f8);
            t_const_value::get_string_abi_cxx11_(&local_168,ppVar10->first);
            _Var1 = std::operator==(psVar8,&local_168);
            std::__cxx11::string::~string((string *)&local_168);
            if (_Var1) {
              pptVar7 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              local_130 = t_field::get_type(*pptVar7);
            }
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&val);
          }
          if (local_130 == (t_type *)0x0) {
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x18))();
            std::operator+(&local_1a8,"type error: ",pbVar13);
            std::operator+(&local_188,&local_1a8," has no field ");
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_f8);
            t_const_value::get_string_abi_cxx11_(&local_1c8,ppVar10->first);
            std::operator+(pbVar12,&local_188,&local_1c8);
            __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          ppVar10 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                    ::operator->(&local_f8);
          render_const_value_abi_cxx11_
                    ((string *)((long)&cap_name.field_2 + 8),this,(ostream *)psVar8,ptVar9,
                     ppVar10->second);
          poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
          poVar3 = std::operator<<(poVar3,(string *)name);
          std::operator<<(poVar3,".");
          ppVar10 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                    ::operator->(&local_f8);
          t_const_value::get_string_abi_cxx11_
                    ((string *)((long)&constructor_args.field_2 + 8),ppVar10->first);
          get_cap_name((string *)local_210,this,(string *)((long)&constructor_args.field_2 + 8));
          std::__cxx11::string::~string((string *)(constructor_args.field_2._M_local_buf + 8));
          poVar3 = std::operator<<((ostream *)name_local,"set");
          poVar3 = std::operator<<(poVar3,(string *)local_210);
          poVar3 = std::operator<<(poVar3,"(");
          poVar3 = std::operator<<(poVar3,(string *)(cap_name.field_2._M_local_buf + 8));
          poVar3 = std::operator<<(poVar3,");");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)local_210);
          std::__cxx11::string::~string((string *)(cap_name.field_2._M_local_buf + 8));
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          operator++(&local_f8);
        }
        if ((local_31 & 1) == 0) {
          t_generator::indent_down((t_generator *)this);
          poVar3 = t_generator::indent((t_generator *)this,(ostream *)name_local);
          poVar3 = std::operator<<(poVar3,"}");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        }
        std::operator<<((ostream *)name_local,(string *)&::endl_abi_cxx11_);
        std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
                  ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_c8);
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)name_local,(string *)name);
      poVar3 = std::operator<<(poVar3," = ");
      render_const_value_abi_cxx11_
                ((string *)&unsorted_fields,this,(ostream *)name_local,(t_type *)value_local,
                 ptStack_30);
      poVar3 = std::operator<<(poVar3,(string *)&unsorted_fields);
      poVar3 = std::operator<<(poVar3,";");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&unsorted_fields);
    }
  }
  else {
    render_const_value_abi_cxx11_
              ((string *)local_88,this,(ostream *)name_local,(t_type *)value_local,ptStack_30);
    poVar3 = std::operator<<((ostream *)name_local,(string *)name);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)local_88);
    poVar3 = std::operator<<(poVar3,";");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_88);
  }
  return;
}

Assistant:

void t_java_generator::print_const_value(std::ostream& out,
                                         string name,
                                         t_type* type,
                                         t_const_value* value,
                                         bool in_static,
                                         bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "" : "public static final ") << type_name(type) << " ";
  }
  if (type->is_base_type()) {
    string v2 = render_const_value(out, type, value);
    out << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    out << name << " = " << render_const_value(out, type, value) << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& unsorted_fields = ((t_struct*)type)->get_members();
    vector<t_field*> fields = unsorted_fields;
    std::sort(fields.begin(), fields.end(), t_field::key_compare());
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << name << " = new " << type_name(type, false, true) << "();" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, field_type, v_iter->second);
      indent(out) << name << ".";
      std::string cap_name = get_cap_name(v_iter->first->get_string());
      out << "set" << cap_name << "(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_map()) {
    std::string constructor_args;
    if (is_enum_map(type)) {
      constructor_args = inner_enum_type_name(type);
    }
    out << name << " = new " << type_name(type, false, true) << "(" << constructor_args << ");" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, ktype, v_iter->first);
      string val = render_const_value(out, vtype, v_iter->second);
      indent(out) << name << ".put(" << key << ", " << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (is_enum_set(type)) {
      out << name << " = " << type_name(type, false, true, true) << ".noneOf(" << inner_enum_type_name(type) << ");" << endl;
    } else {
      out << name << " = new " << type_name(type, false, true) << "();" << endl;
    }
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, etype, *v_iter);
      indent(out) << name << ".add(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}